

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O0

void Abc_SclTimingFree(SC_Timing *p)

{
  SC_Timing *p_local;
  
  Abc_SclSurfaceFree(&p->pCellRise);
  Abc_SclSurfaceFree(&p->pCellFall);
  Abc_SclSurfaceFree(&p->pRiseTrans);
  Abc_SclSurfaceFree(&p->pFallTrans);
  if (p->related_pin != (char *)0x0) {
    free(p->related_pin);
    p->related_pin = (char *)0x0;
  }
  if (p->when_text != (char *)0x0) {
    free(p->when_text);
    p->when_text = (char *)0x0;
  }
  if (p != (SC_Timing *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Abc_SclTimingFree( SC_Timing * p )
{
    Abc_SclSurfaceFree( &p->pCellRise );
    Abc_SclSurfaceFree( &p->pCellFall );
    Abc_SclSurfaceFree( &p->pRiseTrans );
    Abc_SclSurfaceFree( &p->pFallTrans );
    ABC_FREE( p->related_pin );
    ABC_FREE( p->when_text );
    ABC_FREE( p );
}